

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region_fwd.hpp
# Opt level: O3

void __thiscall toml::detail::region::region(region *this)

{
  (this->source_).
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->source_).
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->source_name_)._M_dataplus._M_p = (pointer)&(this->source_name_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->source_name_,"");
  this->last_ = 0;
  this->last_line_ = 0;
  this->first_line_ = 0;
  this->first_column_ = 0;
  this->length_ = 0;
  this->first_ = 0;
  this->last_column_ = 0;
  return;
}

Assistant:

region()
        : source_(nullptr), source_name_(""), length_(0),
          first_(0), first_line_(0), first_column_(0), last_(0), last_line_(0),
          last_column_(0)
    {}